

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_dr_mp3_uninit(ma_dr_mp3 *pMP3)

{
  long in_RDI;
  FILE *pFile;
  ma_allocation_callbacks *in_stack_ffffffffffffffe8;
  FILE *in_stack_fffffffffffffff0;
  
  if (in_RDI != 0) {
    if ((*(code **)(in_RDI + 0x1a18) == ma_dr_mp3__on_read_stdio) &&
       (in_stack_fffffffffffffff0 = *(FILE **)(in_RDI + 0x1a28),
       in_stack_fffffffffffffff0 != (FILE *)0x0)) {
      fclose(in_stack_fffffffffffffff0);
      *(undefined8 *)(in_RDI + 0x1a28) = 0;
    }
    ma_dr_mp3__free_from_callbacks(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

MA_API void ma_dr_mp3_uninit(ma_dr_mp3* pMP3)
{
    if (pMP3 == NULL) {
        return;
    }
#ifndef MA_DR_MP3_NO_STDIO
    if (pMP3->onRead == ma_dr_mp3__on_read_stdio) {
        FILE* pFile = (FILE*)pMP3->pUserData;
        if (pFile != NULL) {
            fclose(pFile);
            pMP3->pUserData = NULL;
        }
    }
#endif
    ma_dr_mp3__free_from_callbacks(pMP3->pData, &pMP3->allocationCallbacks);
}